

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ERK.cpp
# Opt level: O0

void __thiscall RK4::Integrate(RK4 *this)

{
  double t;
  double h;
  int iCol;
  clock_t cVar1;
  Mat local_78 [2];
  Mat local_58;
  undefined1 local_48 [8];
  Mat input;
  int i;
  int local_1c;
  clock_t cStack_18;
  int steps2;
  clock_t t1;
  RK4 *this_local;
  
  t1 = (clock_t)this;
  cStack_18 = clock();
  local_1c = (int)((double)(int)(this->t_final_ - this->t_initial_) / this->h_);
  this->t_out_ = this->t_initial_;
  Mat::operator=((Mat *)&stack0xffffffffffffffd0,&this->y_out_);
  Mat::~Mat((Mat *)&stack0xffffffffffffffd0);
  for (input.v_._4_4_ = 0; input.v_._4_4_ < local_1c; input.v_._4_4_ = input.v_._4_4_ + 1) {
    Mat::GetCol((Mat *)local_48,(int)this + 0x78);
    t = this->t_out_;
    h = this->h_;
    Mat::Mat(&local_58,(Mat *)local_48);
    Step(this,t,&this->y_out_,h,&local_58);
    Mat::~Mat(&local_58);
    iCol = input.v_._4_4_ + 1;
    Mat::Mat(local_78,&this->y_out_);
    Mat::SetCol(&this->Y_Out_,iCol,local_78);
    Mat::~Mat(local_78);
    Mat::~Mat((Mat *)local_48);
  }
  cVar1 = clock();
  this->time_ = (double)(cVar1 - cStack_18) + this->time_;
  return;
}

Assistant:

void RK4::Integrate()
{
	clock_t t1 = clock();	
	int steps2 = (int)(t_final_ - t_initial_) / h_;
	t_out_ = t_initial_;
	y_out_ = y_0_;
	for (int i = 0; i < steps2; i++)
	{
		Mat input = u_vec_.GetCol(i);
		Step(t_out_, y_out_, h_, input);
		Y_Out_.SetCol(i+1, y_out_);
	}
	time_ += (clock()-t1);
}